

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O3

_Bool effect_handler_DETECT_FEARFUL_MONSTERS(effect_handler_context_t_conflict *context)

{
  _Bool _Var1;
  char *fmt;
  
  _Var1 = detect_monsters(context->y,context->x,monster_is_fearful);
  if (_Var1) {
    fmt = "These monsters could provide good sport.";
  }
  else {
    if (context->aware != true) goto LAB_0013f4a4;
    fmt = "You smell no fear in the air.";
  }
  msg(fmt);
LAB_0013f4a4:
  context->ident = true;
  return true;
}

Assistant:

bool effect_handler_DETECT_FEARFUL_MONSTERS(effect_handler_context_t *context)
{
	bool monsters = detect_monsters(context->y, context->x, monster_is_fearful);

	if (monsters)
		msg("These monsters could provide good sport.");
	else if (context->aware)
		msg("You smell no fear in the air.");

	context->ident = true;
	return true;
}